

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_column.h
# Opt level: O1

bool Gudhi::persistence_matrix::operator<
               (Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
                *c1,Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
                    *c2)

{
  uint uVar1;
  uint uVar2;
  pointer ppEVar3;
  pointer ppEVar4;
  ulong uVar5;
  __node_base_ptr p_Var6;
  _Hash_node_base *p_Var7;
  __node_base_ptr p_Var8;
  __hash_code __code;
  ulong uVar9;
  ulong uVar10;
  __node_base_ptr p_Var11;
  pointer ppEVar12;
  pointer ppEVar13;
  bool bVar14;
  
  if (c1 == c2) {
    bVar14 = false;
  }
  else {
    ppEVar13 = (c1->column_).
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppEVar3 = (c1->column_).
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppEVar12 = (c2->column_).
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (ppEVar13 != ppEVar3) {
      ppEVar4 = (c2->column_).
                super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar5 = (c1->erasedValues_)._M_h._M_bucket_count;
      uVar10 = (c2->erasedValues_)._M_h._M_bucket_count;
LAB_001953e7:
      if (ppEVar12 != ppEVar4) {
        for (; ppEVar13 != ppEVar3; ppEVar13 = ppEVar13 + 1) {
          uVar1 = (*ppEVar13)->rowIndex_;
          uVar9 = (ulong)uVar1 % uVar5;
          p_Var6 = (c1->erasedValues_)._M_h._M_buckets[uVar9];
          p_Var8 = (__node_base_ptr)0x0;
          if ((p_Var6 != (__node_base_ptr)0x0) &&
             (p_Var8 = p_Var6, p_Var11 = p_Var6->_M_nxt, uVar1 != *(uint *)&p_Var6->_M_nxt[1]._M_nxt
             )) {
            while (p_Var7 = p_Var11->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
              p_Var8 = (__node_base_ptr)0x0;
              if (((ulong)*(uint *)&p_Var7[1]._M_nxt % uVar5 != uVar9) ||
                 (p_Var8 = p_Var11, p_Var11 = p_Var7, uVar1 == *(uint *)&p_Var7[1]._M_nxt))
              goto LAB_00195452;
            }
            p_Var8 = (__node_base_ptr)0x0;
          }
LAB_00195452:
          if ((p_Var8 == (__node_base_ptr)0x0) || (p_Var8->_M_nxt == (_Hash_node_base *)0x0)) break;
        }
        do {
          if (ppEVar12 == ppEVar4) goto LAB_001954db;
          uVar1 = (*ppEVar12)->rowIndex_;
          uVar9 = (ulong)uVar1 % uVar10;
          p_Var6 = (c2->erasedValues_)._M_h._M_buckets[uVar9];
          p_Var8 = (__node_base_ptr)0x0;
          if ((p_Var6 != (__node_base_ptr)0x0) &&
             (p_Var8 = p_Var6, p_Var11 = p_Var6->_M_nxt, uVar1 != *(uint *)&p_Var6->_M_nxt[1]._M_nxt
             )) {
            while (p_Var7 = p_Var11->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
              p_Var8 = (__node_base_ptr)0x0;
              if (((ulong)*(uint *)&p_Var7[1]._M_nxt % uVar10 != uVar9) ||
                 (p_Var8 = p_Var11, p_Var11 = p_Var7, uVar1 == *(uint *)&p_Var7[1]._M_nxt))
              goto LAB_001954ca;
            }
            p_Var8 = (__node_base_ptr)0x0;
          }
LAB_001954ca:
          if ((p_Var8 == (__node_base_ptr)0x0) || (p_Var8->_M_nxt == (_Hash_node_base *)0x0))
          goto LAB_001954db;
          ppEVar12 = ppEVar12 + 1;
        } while( true );
      }
    }
LAB_00195514:
    ppEVar13 = (c2->column_).
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    bVar14 = ppEVar12 != ppEVar13;
    if (bVar14) {
      uVar5 = (c2->erasedValues_)._M_h._M_bucket_count;
      do {
        uVar1 = (*ppEVar12)->rowIndex_;
        uVar10 = (ulong)uVar1 % uVar5;
        p_Var6 = (c2->erasedValues_)._M_h._M_buckets[uVar10];
        p_Var8 = (__node_base_ptr)0x0;
        if ((p_Var6 != (__node_base_ptr)0x0) &&
           (p_Var8 = p_Var6, p_Var11 = p_Var6->_M_nxt, uVar1 != *(uint *)&p_Var6->_M_nxt[1]._M_nxt))
        {
          while (p_Var7 = p_Var11->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
            p_Var8 = (__node_base_ptr)0x0;
            if (((ulong)*(uint *)&p_Var7[1]._M_nxt % uVar5 != uVar10) ||
               (p_Var8 = p_Var11, p_Var11 = p_Var7, uVar1 == *(uint *)&p_Var7[1]._M_nxt))
            goto LAB_00195589;
          }
          p_Var8 = (__node_base_ptr)0x0;
        }
LAB_00195589:
        if (p_Var8 == (__node_base_ptr)0x0) {
          return bVar14;
        }
        if (p_Var8->_M_nxt == (_Hash_node_base *)0x0) {
          return bVar14;
        }
        ppEVar12 = ppEVar12 + 1;
        bVar14 = ppEVar12 != ppEVar13;
      } while (bVar14);
    }
  }
  return bVar14;
LAB_001954db:
  if ((ppEVar13 == ppEVar3) || (ppEVar12 == ppEVar4)) goto LAB_00195514;
  uVar1 = (*ppEVar12)->rowIndex_;
  uVar2 = (*ppEVar13)->rowIndex_;
  if (uVar2 != uVar1) {
    return uVar2 < uVar1;
  }
  uVar1 = ((*ppEVar12)->super_Entry_field_element_option).element_;
  uVar2 = ((*ppEVar13)->super_Entry_field_element_option).element_;
  if (uVar2 != uVar1) {
    return uVar2 < uVar1;
  }
  ppEVar13 = ppEVar13 + 1;
  ppEVar12 = ppEVar12 + 1;
  if (ppEVar13 == ppEVar3) goto LAB_00195514;
  goto LAB_001953e7;
}

Assistant:

bool operator<(const Vector_column& c1, const Vector_column& c2) {
    if (&c1 == &c2) return false;

    auto it1 = c1.column_.begin();
    auto it2 = c2.column_.begin();
    while (it1 != c1.column_.end() && it2 != c2.column_.end()) {
      if constexpr (!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type) {
        while (it1 != c1.column_.end() && c1.erasedValues_.find((*it1)->get_row_index()) != c1.erasedValues_.end())
          ++it1;
        while (it2 != c2.column_.end() && c2.erasedValues_.find((*it2)->get_row_index()) != c2.erasedValues_.end())
          ++it2;
        if (it1 == c1.column_.end() || it2 == c2.column_.end()) break;
      }

      if ((*it1)->get_row_index() != (*it2)->get_row_index()) return (*it1)->get_row_index() < (*it2)->get_row_index();
      if constexpr (!Master_matrix::Option_list::is_z2) {
        if ((*it1)->get_element() != (*it2)->get_element()) return (*it1)->get_element() < (*it2)->get_element();
      }
      ++it1;
      ++it2;
    }
    if constexpr (!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type) {
      while (it1 != c1.column_.end() && c1.erasedValues_.find((*it1)->get_row_index()) != c1.erasedValues_.end()) ++it1;
      while (it2 != c2.column_.end() && c2.erasedValues_.find((*it2)->get_row_index()) != c2.erasedValues_.end()) ++it2;
    }
    return it2 != c2.column_.end();
  }